

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.h
# Opt level: O3

int PurgeDataMDM(MDM *pMDM)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  bool bVar5;
  fd_set sock_set;
  char recvbuf [1024];
  timeval local_4c8;
  fd_set local_4b8;
  undefined1 local_438 [1032];
  
  iVar2 = (pMDM->RS232Port).DevType;
  if (iVar2 - 1U < 4) {
    iVar2 = (pMDM->RS232Port).s;
    local_4c8.tv_sec = 0;
    local_4c8.tv_usec = 0;
    local_4b8.fds_bits[0] = 0;
    local_4b8.fds_bits[1] = 0;
    local_4b8.fds_bits[2] = 0;
    local_4b8.fds_bits[3] = 0;
    local_4b8.fds_bits[4] = 0;
    local_4b8.fds_bits[5] = 0;
    local_4b8.fds_bits[6] = 0;
    local_4b8.fds_bits[7] = 0;
    local_4b8.fds_bits[8] = 0;
    local_4b8.fds_bits[9] = 0;
    local_4b8.fds_bits[10] = 0;
    local_4b8.fds_bits[0xb] = 0;
    iVar1 = iVar2 + 0x3f;
    if (-1 < iVar2) {
      iVar1 = iVar2;
    }
    local_4b8.fds_bits[0xc] = 0;
    local_4b8.fds_bits[0xd] = 0;
    local_4b8.fds_bits[0xe] = 0;
    local_4b8.fds_bits[0xf] = 0;
    local_4b8.fds_bits[iVar1 >> 6] =
         local_4b8.fds_bits[iVar1 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
    iVar1 = select(iVar2 + 1,&local_4b8,(fd_set *)0x0,(fd_set *)0x0,&local_4c8);
    if (0 < iVar1) {
      do {
        sVar3 = recv(iVar2,local_438,0x400,0);
        if (sVar3 < 1) {
          bVar5 = true;
          goto LAB_001c573b;
        }
        local_4c8.tv_sec = 0;
        local_4c8.tv_usec = 0;
        iVar1 = select(iVar2 + 1,&local_4b8,(fd_set *)0x0,(fd_set *)0x0,&local_4c8);
      } while (0 < iVar1);
    }
    bVar5 = iVar1 == -1;
  }
  else {
    if (iVar2 != 0) goto LAB_001c573f;
    iVar2 = tcflush(*(int *)&(pMDM->RS232Port).hDev,2);
    bVar5 = iVar2 != 0;
  }
LAB_001c573b:
  if (!bVar5) {
    return 0;
  }
LAB_001c573f:
  pcVar4 = strtime_m();
  printf("PurgeDataMDM error (%s) : %s(pMDM=%#x)\n",pcVar4,"Error purging data from a MDM. ",
         (ulong)pMDM & 0xffffffff);
  return 1;
}

Assistant:

inline int PurgeDataMDM(MDM* pMDM)
{
	if (PurgeRS232Port(&pMDM->RS232Port) != EXIT_SUCCESS)
	{
		printf("PurgeDataMDM error (%s) : %s"
			"(pMDM=%#x)\n", 
			strtime_m(), 
			"Error purging data from a MDM. ", 
			(unsigned int)(intptr_t)pMDM);
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}